

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O1

void __thiscall extsector_t::Serialize(extsector_t *this,FArchive *arc)

{
  FLinkedSector *pFVar1;
  DWORD DVar2;
  FArchive *pFVar3;
  ulong uVar4;
  long lVar5;
  
  if (arc->m_Storing == true) {
    FArchive::WriteCount(arc,(this->FakeFloor).Sectors.Count);
  }
  else {
    DVar2 = FArchive::ReadCount(arc);
    TArray<sector_t_*,_sector_t_*>::Resize((TArray<sector_t_*,_sector_t_*> *)this,DVar2);
  }
  if ((this->FakeFloor).Sectors.Count != 0) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      ::operator<<(arc,(sector_t **)((long)(this->FakeFloor).Sectors.Array + lVar5));
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 8;
    } while (uVar4 < (this->FakeFloor).Sectors.Count);
  }
  if (arc->m_Storing == true) {
    FArchive::WriteCount(arc,(this->Midtex).Floor.AttachedLines.Count);
  }
  else {
    DVar2 = FArchive::ReadCount(arc);
    TArray<line_t_*,_line_t_*>::Resize(&(this->Midtex).Floor.AttachedLines,DVar2);
  }
  if ((this->Midtex).Floor.AttachedLines.Count != 0) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      ::operator<<(arc,(line_t **)((long)(this->Midtex).Floor.AttachedLines.Array + lVar5));
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 8;
    } while (uVar4 < (this->Midtex).Floor.AttachedLines.Count);
  }
  if (arc->m_Storing == true) {
    FArchive::WriteCount(arc,(this->Midtex).Floor.AttachedSectors.Count);
  }
  else {
    DVar2 = FArchive::ReadCount(arc);
    TArray<sector_t_*,_sector_t_*>::Resize((TArray<sector_t_*,_sector_t_*> *)&this->Midtex,DVar2);
  }
  if ((this->Midtex).Floor.AttachedSectors.Count != 0) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      ::operator<<(arc,(sector_t **)((long)(this->Midtex).Floor.AttachedSectors.Array + lVar5));
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 8;
    } while (uVar4 < (this->Midtex).Floor.AttachedSectors.Count);
  }
  if (arc->m_Storing == true) {
    FArchive::WriteCount(arc,(this->Midtex).Ceiling.AttachedLines.Count);
  }
  else {
    DVar2 = FArchive::ReadCount(arc);
    TArray<line_t_*,_line_t_*>::Resize(&(this->Midtex).Ceiling.AttachedLines,DVar2);
  }
  if ((this->Midtex).Ceiling.AttachedLines.Count != 0) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      ::operator<<(arc,(line_t **)((long)(this->Midtex).Ceiling.AttachedLines.Array + lVar5));
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 8;
    } while (uVar4 < (this->Midtex).Ceiling.AttachedLines.Count);
  }
  if (arc->m_Storing == true) {
    FArchive::WriteCount(arc,(this->Midtex).Ceiling.AttachedSectors.Count);
  }
  else {
    DVar2 = FArchive::ReadCount(arc);
    TArray<sector_t_*,_sector_t_*>::Resize(&(this->Midtex).Ceiling.AttachedSectors,DVar2);
  }
  if ((this->Midtex).Ceiling.AttachedSectors.Count != 0) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      ::operator<<(arc,(sector_t **)((long)(this->Midtex).Ceiling.AttachedSectors.Array + lVar5));
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 8;
    } while (uVar4 < (this->Midtex).Ceiling.AttachedSectors.Count);
  }
  if (arc->m_Storing == true) {
    FArchive::WriteCount(arc,(this->Linked).Floor.Sectors.Count);
  }
  else {
    DVar2 = FArchive::ReadCount(arc);
    TArray<FLinkedSector,_FLinkedSector>::Resize
              ((TArray<FLinkedSector,_FLinkedSector> *)&this->Linked,DVar2);
  }
  if ((this->Linked).Floor.Sectors.Count != 0) {
    lVar5 = 8;
    uVar4 = 0;
    do {
      pFVar1 = (this->Linked).Floor.Sectors.Array;
      pFVar3 = ::operator<<(arc,(sector_t **)((long)pFVar1 + lVar5 + -8));
      FArchive::operator<<(pFVar3,(DWORD *)((long)&pFVar1->Sector + lVar5));
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (uVar4 < (this->Linked).Floor.Sectors.Count);
  }
  if (arc->m_Storing == true) {
    FArchive::WriteCount(arc,(this->Linked).Ceiling.Sectors.Count);
  }
  else {
    DVar2 = FArchive::ReadCount(arc);
    TArray<FLinkedSector,_FLinkedSector>::Resize(&(this->Linked).Ceiling.Sectors,DVar2);
  }
  if ((this->Linked).Ceiling.Sectors.Count != 0) {
    lVar5 = 8;
    uVar4 = 0;
    do {
      pFVar1 = (this->Linked).Ceiling.Sectors.Array;
      pFVar3 = ::operator<<(arc,(sector_t **)((long)pFVar1 + lVar5 + -8));
      FArchive::operator<<(pFVar3,(DWORD *)((long)&pFVar1->Sector + lVar5));
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (uVar4 < (this->Linked).Ceiling.Sectors.Count);
  }
  return;
}

Assistant:

void extsector_t::Serialize(FArchive &arc)
{
	arc << FakeFloor.Sectors
		<< Midtex.Floor.AttachedLines 
		<< Midtex.Floor.AttachedSectors
		<< Midtex.Ceiling.AttachedLines
		<< Midtex.Ceiling.AttachedSectors
		<< Linked.Floor.Sectors
		<< Linked.Ceiling.Sectors;
}